

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  FILE *__s1;
  bool bVar2;
  int iVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  char *__format;
  FILE *this_00;
  uint uVar7;
  _List_node_base *p_Var8;
  int iVar9;
  allocator<char> local_75;
  int local_74;
  CommandOptions *local_70;
  _List_node_base *local_68;
  char **local_60;
  FILE *local_58;
  _List_node_base *local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  _List_node_base *p_Stack_40;
  size_t *local_38;
  
  this->error_flag = true;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  p_Var8 = (_List_node_base *)&this->filenames;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var8;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = p_Var8;
  this->max_bitrate = 0.0;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   ((long)&(this->filenames).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node._M_size + 7) = 0;
  bVar2 = 1 < argc;
  this_00 = (FILE *)this;
  local_74 = argc;
  local_60 = argv;
  if (1 < argc) {
    local_38 = &(this->filenames).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
    iVar9 = 1;
    local_70 = this;
    local_68 = p_Var8;
    do {
      __s1 = (FILE *)local_60[iVar9];
      this_00 = __s1;
      iVar3 = strcmp((char *)__s1,"-help");
      if (iVar3 == 0) {
switchD_0010cd51_caseD_68:
        this->help_flag = true;
      }
      else if ((char)__s1->_flags == '-') {
        cVar1 = *(char *)((long)&__s1->_flags + 1);
        uVar7 = (uint)cVar1;
        this_00 = (FILE *)(ulong)uVar7;
        iVar3 = isalpha(uVar7);
        p_Var8 = local_68;
        this = local_70;
        if ((9 < uVar7 - 0x30 && iVar3 == 0) || (*(char *)((long)&__s1->_flags + 2) != '\0')) {
          __format = "Unrecognized argument: %s\n";
LAB_0010ce28:
          this_00 = _stderr;
          fprintf(_stderr,__format,__s1);
LAB_0010ce32:
          if (bVar2) {
            return;
          }
          break;
        }
        switch(cVar1) {
        case 'c':
          local_70->showcoding_flag = true;
          break;
        case 'd':
          local_70->showdescriptor_flag = true;
          break;
        case 'e':
        case 'f':
        case 'g':
        case 'j':
        case 'k':
        case 'l':
        case 'm':
        case 'o':
        case 'p':
        case 'q':
        case 's':
        case 'u':
switchD_0010cd51_caseD_65:
          __format = "Unrecognized option: %s\n";
          goto LAB_0010ce28;
        case 'h':
          goto switchD_0010cd51_caseD_68;
        case 'i':
          local_70->showid_flag = true;
          break;
        case 'n':
          local_70->showindex_flag = true;
          break;
        case 'r':
          local_70->showrate_flag = true;
          break;
        case 't':
          iVar9 = iVar9 + 1;
          if ((iVar9 < local_74) &&
             (this_00 = (FILE *)local_60[iVar9], (char)this_00->_flags != '-')) {
            lVar5 = strtol((char *)this_00,(char **)0x0,10);
            lVar6 = -lVar5;
            if (0 < lVar5) {
              lVar6 = lVar5;
            }
            this->max_bitrate = (double)lVar6;
            this->max_bitrate_flag = true;
            break;
          }
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010ce32;
        case 'v':
          local_70->verbose_flag = true;
          break;
        default:
          if (cVar1 == 'H') {
            local_70->showheader_flag = true;
          }
          else {
            if (cVar1 != 'V') goto switchD_0010cd51_caseD_65;
            local_70->version_flag = true;
          }
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,(char *)__s1,&local_75);
        p_Var4 = (_List_node_base *)operator_new(0x30);
        p_Var4[1]._M_next = p_Var4 + 2;
        if (local_58 == (FILE *)&stack0xffffffffffffffb8) {
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
          p_Var4[2]._M_prev = p_Stack_40;
        }
        else {
          p_Var4[1]._M_next = (_List_node_base *)local_58;
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
        }
        p_Var4[1]._M_prev = local_50;
        local_50 = (_List_node_base *)0x0;
        local_48 = 0;
        local_58 = (FILE *)&stack0xffffffffffffffb8;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        *local_38 = *local_38 + 1;
        this_00 = local_58;
        if (local_58 != (FILE *)&stack0xffffffffffffffb8) {
          operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
        }
      }
      iVar9 = iVar9 + 1;
      bVar2 = iVar9 < local_74;
    } while (iVar9 < local_74);
  }
  if ((this->help_flag == false) && (this->version_flag == false)) {
    if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == p_Var8) {
      CommandOptions((CommandOptions *)this_00);
    }
    else {
      this->error_flag = false;
    }
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), help_flag(false), verbose_flag(false),
    showindex_flag(false), showheader_flag(false),
    showid_flag(false), showdescriptor_flag(false), showcoding_flag(false),
    showrate_flag(false), max_bitrate_flag(false), max_bitrate(0.0)
  {
    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'c': showcoding_flag = true; break;
	      case 'd': showdescriptor_flag = true; break;
	      case 'H': showheader_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'i': showid_flag = true; break;
	      case 'n': showindex_flag = true; break;
	      case 'r': showrate_flag = true; break;

	      case 't':
		TEST_EXTRA_ARG(i, 't');
		max_bitrate = Kumu::xabs(strtol(argv[i], 0, 10));
		max_bitrate_flag = true;
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		filenames.push_back(argv[i]);
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( filenames.empty() )
      {
	fputs("At least one filename argument is required.\n", stderr);
	return;
      }

    error_flag = false;
  }